

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  undefined4 uVar2;
  _Manager_type p_Var3;
  ID_index IVar4;
  Column_dimension_option CVar5;
  ID_index IVar6;
  bool bVar7;
  Index IVar8;
  pointer p;
  _Manager_type p_Var9;
  long lVar10;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  *pIVar11;
  ID_index pivot;
  uint uVar12;
  uint uVar13;
  long lVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  *pIVar15;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var3 = this[1].deathComp_.super__Function_base._M_manager;
  lVar14 = (ulong)columnIndex1 * 0x30;
  p_Var9 = p_Var3 + lVar14 + 4;
  if ((ulong)*(uint *)(p_Var3 + lVar14 + 8) == 0xffffffff) {
    if ((ulong)*(uint *)(p_Var3 + (ulong)columnIndex2 * 0x30 + 8) == 0xffffffff) {
      uVar13 = *(uint *)p_Var9;
    }
    else {
      uVar13 = *(uint *)p_Var9;
      if (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + (ulong)columnIndex2 * 0x30 + 8) * 0x30 + 4) <
          *(uint *)(p_Var3 + (ulong)columnIndex2 * 0x30 + 4)) {
LAB_001a6df8:
        lVar10 = (ulong)columnIndex2 * 0x30;
        p_Var9 = p_Var3 + lVar10 + 0x20;
        while( true ) {
          p_Var9 = *(_Manager_type *)p_Var9;
          if (p_Var9 == p_Var3 + lVar10 + 0x20) {
            return columnIndex1;
          }
          if (p_Var9 == (_Manager_type)0x0) break;
          if (*(uint *)(p_Var9 + 0x10) == uVar13) {
            pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                       *)(p_Var3 + lVar10);
            uVar13 = *(uint *)(p_Var3 + lVar10 + 4);
            pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                       *)(p_Var3 + lVar14);
            local_38.targetColumn = pIVar11;
            bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                              (pIVar15,pIVar11,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
            if (bVar7) {
              CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
              IVar6 = (pIVar11->super_Chain_column_option).pivot_;
              IVar4 = (pIVar15->super_Chain_column_option).pivot_;
              pIVar11->super_Column_dimension_option =
                   (Column_dimension_option)(pIVar15->super_Column_dimension_option).dim_;
              (pIVar11->super_Chain_column_option).pivot_ = IVar4;
              pIVar15->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
              (pIVar15->super_Chain_column_option).pivot_ = IVar6;
            }
            uVar1 = (pIVar11->super_Chain_column_option).pivot_;
            if (uVar13 == uVar1) {
              return columnIndex1;
            }
            lVar14 = *(long *)((long)&this[2].birthComp_.super__Function_base._M_functor + 8);
            uVar2 = *(undefined4 *)(lVar14 + (ulong)uVar13 * 4);
            *(undefined4 *)(lVar14 + (ulong)uVar13 * 4) = *(undefined4 *)(lVar14 + (ulong)uVar1 * 4)
            ;
            *(undefined4 *)(lVar14 + (ulong)uVar1 * 4) = uVar2;
            return columnIndex1;
          }
        }
LAB_001a6edb:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>::Matrix_column_tag, Type = 1]"
                     );
      }
    }
LAB_001a6e9b:
    p_Var9 = p_Var3 + (ulong)columnIndex2 * 0x30 + 0x20;
    while (p_Var9 = *(_Manager_type *)p_Var9, p_Var9 != p_Var3 + (ulong)columnIndex2 * 0x30 + 0x20)
    {
      if (p_Var9 == (_Manager_type)0x0) goto LAB_001a6edb;
      if (*(uint *)(p_Var9 + 0x10) == uVar13) {
        IVar8 = _positive_vine_swap(this,columnIndex1,columnIndex2);
        return IVar8;
      }
    }
  }
  else {
    uVar13 = *(uint *)p_Var9;
    uVar1 = *(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar14 + 8) * 0x30 + 4);
    lVar10 = (ulong)columnIndex2 * 0x30;
    if ((ulong)*(uint *)(p_Var3 + lVar10 + 8) == 0xffffffff) {
      uVar12 = uVar13;
      if (uVar13 <= uVar1) goto LAB_001a6e9b;
    }
    else {
      uVar12 = *(uint *)p_Var9;
      if ((uVar1 < uVar13) &&
         (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar10 + 8) * 0x30 + 4) <
          *(uint *)(p_Var3 + lVar10 + 4))) {
        p_Var9 = p_Var3 + lVar10 + 0x20;
        while( true ) {
          p_Var9 = *(_Manager_type *)p_Var9;
          if (p_Var9 == p_Var3 + lVar10 + 0x20) {
            return columnIndex1;
          }
          if (p_Var9 == (_Manager_type)0x0) break;
          if (*(uint *)(p_Var9 + 0x10) == uVar12) {
            IVar8 = _negative_vine_swap(this,columnIndex1,columnIndex2);
            return IVar8;
          }
        }
        goto LAB_001a6edb;
      }
      if (uVar13 <= uVar1) {
        uVar13 = uVar12;
        if (*(uint *)(p_Var3 + (ulong)*(uint *)(p_Var3 + lVar10 + 8) * 0x30 + 4) <
            *(uint *)(p_Var3 + lVar10 + 4)) goto LAB_001a6df8;
        goto LAB_001a6e9b;
      }
    }
    p_Var9 = p_Var3 + lVar10 + 0x20;
    do {
      p_Var9 = *(_Manager_type *)p_Var9;
      if (p_Var9 == p_Var3 + lVar10 + 0x20) {
        return columnIndex1;
      }
      if (p_Var9 == (_Manager_type)0x0) goto LAB_001a6edb;
    } while (*(uint *)(p_Var9 + 0x10) != uVar12);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
               *)(p_Var3 + lVar14);
    pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
               *)(p_Var3 + lVar10);
    local_38.targetColumn = pIVar15;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar11,pIVar15,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
    if (bVar7) {
      CVar5.dim_ = (pIVar15->super_Column_dimension_option).dim_;
      IVar6 = (pIVar15->super_Chain_column_option).pivot_;
      IVar4 = (pIVar11->super_Chain_column_option).pivot_;
      pIVar15->super_Column_dimension_option =
           (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar4;
      pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
      (pIVar11->super_Chain_column_option).pivot_ = IVar6;
    }
    uVar13 = (pIVar15->super_Chain_column_option).pivot_;
    columnIndex1 = columnIndex2;
    if (uVar12 != uVar13) {
      lVar14 = *(long *)((long)&this[2].birthComp_.super__Function_base._M_functor + 8);
      uVar2 = *(undefined4 *)(lVar14 + (ulong)uVar12 * 4);
      *(undefined4 *)(lVar14 + (ulong)uVar12 * 4) = *(undefined4 *)(lVar14 + (ulong)uVar13 * 4);
      *(undefined4 *)(lVar14 + (ulong)uVar13 * 4) = uVar2;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}